

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-types.c
# Opt level: O3

fy_eventp * fy_parse_eventp_alloc_simple(fy_parser *fyp)

{
  fy_eventp *pfVar1;
  
  pfVar1 = fy_eventp_alloc_simple_internal(&fyp->recycled_eventp);
  return pfVar1;
}

Assistant:

struct fy_eventp *fy_parse_eventp_alloc(struct fy_parser *fyp) {
    struct fy_eventp *fyep;

    fyep = fy_parse_eventp_alloc_simple(fyp);
    if (!fyep)
        return NULL;
    fyep->fyp = fyp;
    fyep->e.type = FYET_NONE;

    return fyep;
}